

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void __thiscall
ArgsManager::logArgsPrefix
          (ArgsManager *this,string *prefix,string *section,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          *args)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  reference ppVar2;
  reference pUVar3;
  uint *puVar4;
  ConstevalFormatString<4U> in_RDX;
  __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Level unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  UniValue *value;
  vector<UniValue,_std::allocator<UniValue>_> *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>
  *arg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  optional<unsigned_int> flags;
  string value_str;
  string section_str;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  char *in_stack_fffffffffffffe60;
  __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
  *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  reference in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe98;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffec0;
  byte bVar5;
  int source_line;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined1 local_b9 [40];
  undefined1 local_91 [105];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (bVar1) {
    in_stack_fffffffffffffea8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
               (allocator<char> *)in_stack_fffffffffffffe98);
    std::allocator<char>::~allocator((allocator<char> *)local_91);
  }
  else {
    std::operator+((char *)in_stack_fffffffffffffea8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffea0);
    std::operator+(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  local_b9._25_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                *)in_stack_fffffffffffffe60);
  local_b9._17_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
              *)in_stack_fffffffffffffe60);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe68,
                                 (_Self *)in_stack_fffffffffffffe60), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_b9._9_8_ =
         std::vector<UniValue,_std::allocator<UniValue>_>::begin
                   ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffe60);
    local_b9._1_8_ =
         std::vector<UniValue,_std::allocator<UniValue>_>::end
                   ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffe60);
    while (bVar1 = __gnu_cxx::
                   operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             (in_stack_fffffffffffffe68,
                              (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               *)in_stack_fffffffffffffe60), ((bVar1 ^ 0xffU) & 1) != 0) {
      pUVar3 = __gnu_cxx::
               __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
               ::operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::operator+((char)((ulong)in_stack_fffffffffffffea8 >> 0x38),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffea0);
      in_stack_fffffffffffffea0 =
           (_Optional_payload_base<unsigned_int>)
           GetArgFlags((ArgsManager *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_91._1_8_ = in_stack_fffffffffffffea0;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if (bVar1) {
        puVar4 = std::optional<unsigned_int>::operator*
                           ((optional<unsigned_int> *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar5 = 0;
        if ((*puVar4 & 0x400) == 0) {
          UniValue::write_abi_cxx11_((UniValue *)(local_91 + 9),(int)pUVar3,(void *)0x0,0);
          source_line = (int)((ulong)pUVar3 >> 0x20);
          in_stack_fffffffffffffe68 = in_RSI;
        }
        else {
          in_stack_fffffffffffffe98 = (string *)local_b9;
          std::allocator<char>::allocator();
          source_line = (int)((ulong)pUVar3 >> 0x20);
          bVar5 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                     (allocator<char> *)in_stack_fffffffffffffe98);
          in_stack_fffffffffffffe68 = in_RSI;
        }
        if ((bVar5 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)local_b9);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78,
                   (char *)in_stack_fffffffffffffe70);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78,
                   (char *)in_stack_fffffffffffffe70);
        in_stack_fffffffffffffe70 = &local_28;
        in_stack_fffffffffffffe60 = "%s %s%s=%s\n";
        in_stack_fffffffffffffe58 = 2;
        logging_function._M_str = in_stack_ffffffffffffff28;
        logging_function._M_len = in_stack_ffffffffffffff20;
        source_file._M_str = in_RDI;
        source_file._M_len = (size_t)in_stack_fffffffffffffe68;
        in_stack_fffffffffffffe78 = ppVar2;
        in_RSI = in_stack_fffffffffffffe68;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,source_line,
                   CONCAT17(bVar5,in_stack_fffffffffffffec0),unaff_retaddr,in_RDX,in_stack_00000010,
                   in_stack_00000018,in_stack_00000020,in_stack_00000028);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::logArgsPrefix(
    const std::string& prefix,
    const std::string& section,
    const std::map<std::string, std::vector<common::SettingsValue>>& args) const
{
    std::string section_str = section.empty() ? "" : "[" + section + "] ";
    for (const auto& arg : args) {
        for (const auto& value : arg.second) {
            std::optional<unsigned int> flags = GetArgFlags('-' + arg.first);
            if (flags) {
                std::string value_str = (*flags & SENSITIVE) ? "****" : value.write();
                LogPrintf("%s %s%s=%s\n", prefix, section_str, arg.first, value_str);
            }
        }
    }
}